

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.h
# Opt level: O2

void __thiscall
server::ctfservmode::dopassflagsequence(ctfservmode *this,clientinfo *actor,clientinfo *target)

{
  int iVar1;
  flag *pfVar2;
  char *pcVar3;
  char *pcVar4;
  int *piVar5;
  long lVar6;
  flag *f;
  int i;
  long lVar7;
  
  for (lVar7 = 0; lVar7 < (this->flags).ulen; lVar7 = lVar7 + 1) {
    pfVar2 = (this->flags).buf;
    if (pfVar2[lVar7].owner == actor->clientnum) {
      pfVar2[lVar7].droptime = 0;
      pfVar2[lVar7].holdtime = 0;
      pfVar2[lVar7].owner = -1;
      pfVar2[lVar7].dropcount = 0;
      pfVar2[lVar7].dropper = -1;
      pfVar2[lVar7].invistime = 0;
      dropflag(this,actor,(clientinfo *)0x0);
      iVar1 = (this->flags).ulen;
      piVar5 = &((this->flags).buf)->dropper;
      for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
        if (*piVar5 == actor->clientnum) {
          *(undefined8 *)(piVar5 + -1) = 0xffffffff00000000;
        }
        piVar5 = piVar5 + 0x11;
      }
      takeflag(this,target,(int)lVar7,pfVar2[lVar7].version);
      (*(this->super_servmode)._vptr_servmode[0xc])(this);
      pcVar3 = colorname(actor);
      pcVar4 = colorname(target);
      out(3,"\f0%s \f7passed the flag to \f6%s",pcVar3,pcVar4);
      target->hasPassedFlag = true;
    }
  }
  return;
}

Assistant:

void dopassflagsequence(clientinfo *actor, clientinfo *target)
    {
        loopv(flags)
            {
                flag &f = flags[i];
                if(flags[i].owner == actor->clientnum) {
                    returnflag(i);
                    dropflag(actor);
                    loopv(flags) if(flags[i].dropper == actor->clientnum) { flags[i].dropper = -1; flags[i].dropcount = 0; }
                    takeflag(target, i, f.version);
                    update();
                    out(ECHO_SERV, "\f0%s \f7passed the flag to \f6%s", colorname(actor), colorname(target));
                    target->hasPassedFlag = true;
                }
            }
    }